

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_duplicate(Integer g_a,Integer *g_b,char *array_name)

{
  char **ppcVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  char **type;
  C_Integer *pCVar5;
  char *in_RDX;
  long *in_RSI;
  Integer in_RDI;
  bool bVar6;
  char err_string_1 [256];
  char err_string [256];
  int maplen;
  Integer grp_me;
  Integer grp_id;
  int local_sync_end;
  int local_sync_begin;
  Integer status;
  Integer ga_handle;
  Integer i;
  C_Long mem_size_proc;
  C_Long mem_size;
  char **save_ptr;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  char *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  void *in_stack_fffffffffffffd70;
  char **in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 uVar7;
  char local_278 [8];
  Integer in_stack_fffffffffffffd90;
  Integer *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  long *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb4;
  C_Long in_stack_fffffffffffffdb8;
  char **in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  char local_178 [112];
  Integer in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  Integer local_68;
  long local_48;
  long local_40;
  logical local_8;
  
  iVar3 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  local_68 = GAme;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  type = (char **)pnga_get_pgroup(in_RDI);
  if (iVar4 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffd60);
  }
  if (0 < (long)type) {
    local_68 = (Integer)PGRP_LIST[(long)type].map_proc_list[GAme];
  }
  GAstat.numcre = GAstat.numcre + 1;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_178,"%s: INVALID ARRAY HANDLE","ga_duplicate");
    pnga_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  if (GA[in_RDI + 1000].actv == 0) {
    sprintf(local_278,"%s: ARRAY NOT ACTIVE","ga_duplicate");
    pnga_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  local_48 = -1;
  local_40 = 0;
  do {
    if (GA[local_40].actv_handle == 0) {
      local_48 = local_40;
    }
    local_40 = local_40 + 1;
    uVar7 = local_40 < _max_global_array && local_48 == -1;
  } while ((bool)uVar7);
  if (local_48 == -1) {
    pnga_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  *in_RSI = local_48 + -1000;
  GA[local_48].actv_handle = 1;
  gai_init_struct(0);
  ppcVar1 = GA[local_48].ptr;
  memcpy(GA + local_48,GA + in_RDI + 1000,0x368);
  strcpy(GA[local_48].name,in_RDX);
  GA[local_48].ptr = ppcVar1;
  GA[local_48].distr_type = GA[in_RDI + 1000].distr_type;
  iVar4 = calc_maplen((int)in_RDI + 1000);
  if (0 < iVar4) {
    pCVar5 = (C_Integer *)malloc((long)(iVar4 + 1) << 3);
    GA[local_48].mapc = pCVar5;
    for (local_40 = 0; local_40 < iVar4; local_40 = local_40 + 1) {
      GA[local_48].mapc[local_40] = GA[in_RDI + 1000].mapc[local_40];
    }
    GA[local_48].mapc[iVar4] = -1;
  }
  GA[local_48].cache = (double *)0x0;
  pnga_set_ghost_info(CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  GA[local_48].rstrctd_list = (C_Integer *)0x0;
  GA[local_48].rank_rstrctd = (C_Integer *)0x0;
  GA[local_48].num_rstrctd = 0;
  if (0 < GA[in_RDI + 1000].num_rstrctd) {
    GA[local_48].num_rstrctd = GA[in_RDI + 1000].num_rstrctd;
    pnga_set_restricted(CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  }
  lVar2 = GA[local_48].size;
  GA[local_48].id = -1;
  if (GA_memory_limited == 0) {
    bVar6 = true;
  }
  else {
    GA_total_memory = GA_total_memory - lVar2;
    bVar6 = -1 < GA_total_memory;
    if ((long)type < 1) {
      pnga_type_f2c(0x3f2);
      pnga_gop(CONCAT17(uVar7,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78,
               (Integer)in_stack_fffffffffffffd70,
               (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    else {
      pnga_type_f2c(0x3f2);
      pnga_pgroup_gop(CONCAT17(uVar7,in_stack_fffffffffffffd80),(Integer)type,
                      in_stack_fffffffffffffd70,
                      CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                      in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd78 = type;
    }
  }
  if (bVar6) {
    if (GA[local_48].mem_dev_set == 0) {
      iVar4 = gai_getmem((char *)CONCAT17(uVar7,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78
                         ,(C_Long)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                         (long *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    }
    else {
      in_stack_fffffffffffffd60 = GA[local_48].mem_dev;
      iVar4 = gai_get_devmem(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
                             in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                             in_stack_fffffffffffffde0,in_stack_fffffffffffffde8);
    }
    bVar6 = iVar4 == 0;
  }
  else {
    GA[local_48].ptr[local_68] = (char *)0x0;
    bVar6 = false;
  }
  if (iVar3 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffd60);
  }
  if (bVar6) {
    GAstat.curmem = GA[local_48].size + GAstat.curmem;
    lVar2 = GAstat.curmem;
    if (GAstat.curmem <= GAstat.maxmem) {
      lVar2 = GAstat.maxmem;
    }
    GAstat.maxmem = lVar2;
    local_8 = 1;
  }
  else {
    if (GA_memory_limited != 0) {
      GA_total_memory = lVar2 + GA_total_memory;
    }
    pnga_destroy((Integer)in_stack_fffffffffffffd78);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

logical pnga_duplicate(Integer g_a, Integer *g_b, char* array_name)
{
  char     **save_ptr;
  C_Long  mem_size, mem_size_proc;
  Integer  i, ga_handle, status;
  int local_sync_begin,local_sync_end;
  Integer grp_id, grp_me=GAme;
  /* Integer grp_nproc=GAnproc; */
  int maplen;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);

  if (grp_id > 0) {
    /* grp_nproc  = PGRP_LIST[grp_id].map_nproc; */
    grp_me = PGRP_LIST[grp_id].map_proc_list[GAme];
  }

  GAstat.numcre ++; 

  ga_check_handleM(g_a,"ga_duplicate");       

  /* find a free global_array handle for g_b */
  ga_handle =-1; i=0;
  do{
    if(!GA[i].actv_handle) ga_handle=i;
    i++;
  }while(i<_max_global_array && ga_handle==-1);
  if( ga_handle == -1)
    pnga_error("ga_duplicate: too many arrays", (Integer)_max_global_array);
  *g_b = (Integer)ga_handle - GA_OFFSET;
   GA[ga_handle].actv_handle = 1;

  gai_init_struct(ga_handle);

  /*** copy content of the data structure ***/
  save_ptr = GA[ga_handle].ptr;
  GA[ga_handle] = GA[GA_OFFSET + g_a]; /* <--- shallow copy */
  strcpy(GA[ga_handle].name, array_name);
  GA[ga_handle].ptr = save_ptr;
  GA[ga_handle].distr_type = GA[GA_OFFSET + g_a].distr_type;
  maplen = calc_maplen(GA_OFFSET + g_a);
  if (maplen > 0) {
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i=0;i<maplen; i++)GA[ga_handle].mapc[i] = GA[GA_OFFSET+ g_a].mapc[i];
    GA[ga_handle].mapc[maplen] = -1;
  }

  /*** if ghost cells are used, initialize ghost cache data ***/
  GA[ga_handle].cache = NULL;
  pnga_set_ghost_info(*g_b);

  /*** initialize and copy info for restricted arrays, if relevant ***/
  GA[ga_handle].rstrctd_list = NULL;
  GA[ga_handle].rank_rstrctd = NULL;
  GA[ga_handle].num_rstrctd = 0;
  if (GA[GA_OFFSET + g_a].num_rstrctd > 0) {
    GA[ga_handle].num_rstrctd = GA[GA_OFFSET + g_a].num_rstrctd;
    pnga_set_restricted(*g_b, GA[GA_OFFSET + g_a].rstrctd_list,
        GA[GA_OFFSET + g_a].num_rstrctd);
  }

  /*** Memory Allocation & Initialization of GA Addressing Space ***/
  mem_size = mem_size_proc = GA[ga_handle].size; 
  GA[ga_handle].id = INVALID_MA_HANDLE;
  /* if requested, enforce limits on memory consumption */
  if(GA_memory_limited) GA_total_memory -= mem_size_proc;

  /* check if everybody has enough memory left */
  if(GA_memory_limited){
    status = (GA_total_memory >= 0) ? 1 : 0;
    if (grp_id > 0) {
      /* pnga_pgroup_gop(grp_id, pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
      pnga_pgroup_gop(grp_id, pnga_type_f2c(MT_F_INT), &status, 1, "&&");
      status = (Integer)status;
    } else {
      /* pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
      pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
    }
  }else status = 1;

  if(status)
  {
    if (GA[ga_handle].mem_dev_set) {
      status = !gai_get_devmem(array_name, GA[ga_handle].ptr,mem_size,
          (int)GA[ga_handle].type, &GA[ga_handle].id,
          (int)grp_id,GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
    } else {
      status = !gai_getmem(array_name, GA[ga_handle].ptr,mem_size,
          (int)GA[ga_handle].type, &GA[ga_handle].id,
          (int)grp_id);
    }
}
  else{
    GA[ga_handle].ptr[grp_me]=NULL;
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

#     ifdef GA_CREATE_INDEF
  /* This code is incorrect. It needs to fixed if INDEF is ever used */
  if(status){
    Integer one = 1; 
    Integer dim1 =(Integer)GA[ga_handle].dims[1], dim2=(Integer)GA[ga_handle].dims[2];
    if(GAme==0)fprintf(stderr,"duplicate:initializing GA array%ld\n",g_b);
    if(GA[ga_handle].type == C_DBL) {
      double bad = (double) DBL_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_INT) {
      int bad = (int) INT_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_LONG) {
      long bad = LONG_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_LONGLONG) {
      long long bad = LONG_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_DCPL) { 
      DoubleComplex bad = {DBL_MAX, DBL_MAX};
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_SCPL) { 
      SingleComplex bad = {FLT_MAX, FLT_MAX};
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_FLOAT) {
      float bad = FLT_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);   
    } else {
      pnga_error("ga_duplicate: type not supported ",GA[ga_handle].type);
    }
  }
#     endif

  if(status){
    GAstat.curmem += (long)GA[ga_handle].size;
    GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);
    return(TRUE);
  }else{ 
    if (GA_memory_limited) GA_total_memory += mem_size_proc;
    pnga_destroy(*g_b);
    return(FALSE);
  }
}